

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_87eea::GeneratedCode_DeepCloneMessageMapField_Test::TestBody
          (GeneratedCode_DeepCloneMessageMapField_Test *this)

{
  upb_StringView a;
  bool bVar1;
  upb_Arena *arena;
  protobuf_test_messages_proto2_TestAllTypesProto2 *ppVar2;
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *msg;
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *msg_00;
  upb_Arena *arena_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  long *plVar3;
  char *pcVar4;
  char *in_R9;
  upb_Arena *expected_predicate_value;
  upb_StringView uVar5;
  upb_StringView uVar6;
  int32_t key;
  size_t iter_3;
  AssertionResult gtest_ar_;
  bool value;
  AssertionResult gtest_ar;
  size_t iter_1;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  size_t iter;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  arena = upb_Arena_New();
  ppVar2 = protobuf_test_messages_proto2_TestAllTypesProto2_new(arena);
  bVar1 = protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_bool_set(ppVar2,0,true,arena);
  gtest_ar_.success_ = bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    bVar1 = protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_set
                      (ppVar2,0xc,1200.5,arena);
    gtest_ar_.success_ = bVar1;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (bVar1) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      uVar5 = upb_StringView_FromString("key1");
      uVar6 = upb_StringView_FromString("value1");
      expected_predicate_value = arena;
      bVar1 = protobuf_test_messages_proto2_TestAllTypesProto2_map_string_string_set
                        (ppVar2,uVar5,uVar6,arena);
      gtest_ar_.success_ = bVar1;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (bVar1) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        msg = protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_new(arena);
        protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_set_a(msg,0x7b);
        msg_00 = protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_new(arena);
        protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_set_a(msg_00,0x75bcd15);
        bVar1 = protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_set
                          (ppVar2,1,msg_00,arena);
        gtest_ar_.success_ = bVar1;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (bVar1) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          uVar5 = upb_StringView_FromString("nestedkey1");
          bVar1 = protobuf_test_messages_proto2_TestAllTypesProto2_map_string_nested_message_set
                            (ppVar2,uVar5,msg,arena);
          gtest_ar_.success_ = bVar1;
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (bVar1) {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            arena_00 = upb_Arena_New();
            ppVar2 = (protobuf_test_messages_proto2_TestAllTypesProto2 *)
                     upb_Message_DeepClone
                               (&ppVar2->base_dont_copy_me__upb_internal_use_only,
                                &protobuf_0test_0messages__proto2__TestAllTypesProto2_msg_init,
                                arena_00);
            protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_set_a(msg,0);
            upb_Arena_Free(arena);
            iter._0_4_ = 0xffffffff;
            iter._4_4_ = 0xffffffff;
            bVar1 = protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_bool_next
                              (ppVar2,&key,&value,&iter);
            gtest_ar_.success_ = bVar1;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if (bVar1) {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              gtest_ar_.success_ = false;
              gtest_ar_._1_3_ = 0;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar,"key","0",&key,(int *)&gtest_ar_);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = *(char **)gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&iter_1,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                           ,0xd7,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&iter_1,(Message *)&gtest_ar_);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iter_1);
                if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar.message_);
              gtest_ar_.success_ = true;
              testing::internal::CmpHelperEQ<bool,bool>
                        ((internal *)&gtest_ar,"value","true",&value,&gtest_ar_.success_);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = *(char **)gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&iter_1,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                           ,0xd8,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&iter_1,(Message *)&gtest_ar_);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iter_1);
                if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar.message_);
              bVar1 = protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_bool_next
                                (ppVar2,&key,&value,&iter);
              gtest_ar_.success_ = !bVar1;
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (bVar1) {
                testing::Message::Message((Message *)&iter_1);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar_,
                           (AssertionResult *)
                           "protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_bool_next( clone, &key, &value, &iter)"
                           ,"true","false",(char *)expected_predicate_value);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&iter_3,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                           ,0xdc,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&iter_3,(Message *)&iter_1);
                goto LAB_00155f65;
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              iter_1 = 0xffffffffffffffff;
              bVar1 = protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_next
                                (ppVar2,(int32_t *)&value,(double *)&iter,&iter_1);
              gtest_ar_.success_ = bVar1;
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (bVar1) {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                gtest_ar_.success_ = true;
                gtest_ar_._1_3_ = 0;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"key","12",(int *)&value,(int *)&gtest_ar_);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_);
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl ==
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar4 = "";
                  }
                  else {
                    pcVar4 = *(char **)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&iter_3,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                             ,0xe8,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&iter_3,(Message *)&gtest_ar_);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iter_3);
                  if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                gtest_ar_.success_ = false;
                gtest_ar_._1_3_ = 0;
                gtest_ar_._4_4_ = 0x4092c200;
                testing::internal::CmpHelperEQ<double,double>
                          ((internal *)&gtest_ar,"value","1200.5",(double *)&iter,
                           (double *)&gtest_ar_);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_);
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl ==
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar4 = "";
                  }
                  else {
                    pcVar4 = *(char **)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&iter_3,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                             ,0xe9,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&iter_3,(Message *)&gtest_ar_);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iter_3);
                  if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                bVar1 = protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_next
                                  (ppVar2,(int32_t *)&value,(double *)&iter,&iter_1);
                gtest_ar_.success_ = !bVar1;
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                if (bVar1) {
                  testing::Message::Message((Message *)&iter_3);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar,(internal *)&gtest_ar_,
                             (AssertionResult *)
                             "protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_next( clone, &key, &value, &iter)"
                             ,"true","false",(char *)expected_predicate_value);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&key,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                             ,0xed,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&key,(Message *)&iter_3);
                  goto LAB_001562dc;
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                iter_1 = 0xffffffffffffffff;
                bVar1 = protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_next
                                  (ppVar2,(int32_t *)&value,
                                   (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage
                                    **)&iter,&iter_1);
                gtest_ar_.success_ = bVar1;
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                if (!bVar1) {
                  testing::Message::Message((Message *)&iter_3);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar,(internal *)&gtest_ar_,
                             (AssertionResult *)
                             "protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_next( clone, &key, &value, &iter)"
                             ,"false","true",(char *)expected_predicate_value);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&key,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                             ,0xf7,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&key,(Message *)&iter_3);
                  goto LAB_001562dc;
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                gtest_ar_.success_ = true;
                gtest_ar_._1_3_ = 0;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"key","1",(int *)&value,(int *)&gtest_ar_);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_);
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl ==
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar4 = "";
                  }
                  else {
                    pcVar4 = *(char **)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&iter_3,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                             ,0xf8,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&iter_3,(Message *)&gtest_ar_);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iter_3);
                  if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                gtest_ar_.success_ = false;
                gtest_ar_._1_3_ = 0;
                gtest_ar_._4_4_ = 0;
                testing::internal::
                CmpHelperNE<protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_const*,decltype(nullptr)>
                          ((internal *)&gtest_ar,"value","nullptr",
                           (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage **)&iter,
                           (void **)&gtest_ar_);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_);
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl ==
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar4 = "";
                  }
                  else {
                    pcVar4 = *(char **)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&iter_3,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                             ,0xf9,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&iter_3,(Message *)&gtest_ar_);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iter_3);
                  plVar3 = (long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_);
LAB_00156446:
                  this_00 = &gtest_ar.message_;
                  if (plVar3 != (long *)0x0) {
                    (**(code **)(*plVar3 + 8))();
                  }
                  goto LAB_00155d7f;
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                gtest_ar_._0_4_ =
                     protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_a
                               ((protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *)
                                CONCAT44(iter._4_4_,(int32_t)iter));
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,
                           "protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_a(value)"
                           ,"kTestNestedInt64",(int *)&gtest_ar_,
                           &::(anonymous_namespace)::kTestNestedInt64);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_);
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl ==
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar4 = "";
                  }
                  else {
                    pcVar4 = *(char **)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&iter_3,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                             ,0xfc,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&iter_3,(Message *)&gtest_ar_);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iter_3);
                  if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                bVar1 = protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_next
                                  (ppVar2,(int32_t *)&value,
                                   (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage
                                    **)&iter,&iter_1);
                gtest_ar_.success_ = !bVar1;
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                if (bVar1) {
                  testing::Message::Message((Message *)&iter_3);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar,(internal *)&gtest_ar_,
                             (AssertionResult *)
                             "protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_next( clone, &key, &value, &iter)"
                             ,"true","false",(char *)expected_predicate_value);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&key,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                             ,0xff,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&key,(Message *)&iter_3);
                  goto LAB_001562dc;
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                iter_3 = 0xffffffffffffffff;
                bVar1 = protobuf_test_messages_proto2_TestAllTypesProto2_map_string_string_next
                                  (ppVar2,(upb_StringView *)&gtest_ar_,(upb_StringView *)&iter,
                                   &iter_3);
                this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_40;
                iter_1 = CONCAT71(iter_1._1_7_,bVar1);
                local_40._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                if (bVar1) {
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(this_00);
                  uVar5.data._4_4_ = gtest_ar_._4_4_;
                  uVar5.data._0_1_ = gtest_ar_.success_;
                  uVar5.data._1_3_ = gtest_ar_._1_3_;
                  uVar5.size = (size_t)gtest_ar_.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  uVar6 = upb_StringView_FromString("key1");
                  bVar1 = upb_StringView_IsEqual(uVar5,uVar6);
                  iter_1 = CONCAT71(iter_1._1_7_,bVar1);
                  local_40._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  if (!bVar1) {
                    testing::Message::Message((Message *)&key);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&iter_1,
                               (AssertionResult *)
                               "upb_StringView_IsEqual(key, upb_StringView_FromString(\"key1\"))",
                               "false","true",(char *)expected_predicate_value);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&value,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                               ,0x10b,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&value,(Message *)&key);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
                    std::__cxx11::string::~string((string *)&gtest_ar);
                    if (_key != (AssertHelperData *)0x0) {
                      (**(code **)(*(long *)_key + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&local_40);
                  uVar6.data._4_4_ = iter._4_4_;
                  uVar6.data._0_4_ = (int32_t)iter;
                  uVar6.size = (size_t)local_30._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  uVar5 = upb_StringView_FromString("value1");
                  bVar1 = upb_StringView_IsEqual(uVar6,uVar5);
                  iter_1 = CONCAT71(iter_1._1_7_,bVar1);
                  local_40._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  if (!bVar1) {
                    testing::Message::Message((Message *)&key);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&iter_1,
                               (AssertionResult *)
                               "upb_StringView_IsEqual(value, upb_StringView_FromString(\"value1\"))"
                               ,"false","true",(char *)expected_predicate_value);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&value,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                               ,0x10d,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&value,(Message *)&key);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
                    std::__cxx11::string::~string((string *)&gtest_ar);
                    if (_key != (AssertHelperData *)0x0) {
                      (**(code **)(*(long *)_key + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&local_40);
                  iter_3 = 0xffffffffffffffff;
                  bVar1 = protobuf_test_messages_proto2_TestAllTypesProto2_map_string_nested_message_next
                                    (ppVar2,(upb_StringView *)&gtest_ar_,
                                     (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage
                                      **)&iter_1,&iter_3);
                  this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_30;
                  iter._0_4_ = CONCAT31(iter._1_3_,bVar1);
                  local_30._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  if (!bVar1) {
                    testing::Message::Message((Message *)&key);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&iter,
                               (AssertionResult *)
                               "protobuf_test_messages_proto2_TestAllTypesProto2_map_string_nested_message_next( clone, &key, &value, &iter)"
                               ,"false","true",(char *)expected_predicate_value);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&value,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                               ,0x117,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&value,(Message *)&key);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
                    std::__cxx11::string::~string((string *)&gtest_ar);
                    if (_key != (AssertHelperData *)0x0) {
                      (**(code **)(*(long *)_key + 8))();
                    }
                    goto LAB_00155d7f;
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(this_00);
                  a.data._4_4_ = gtest_ar_._4_4_;
                  a.data._0_1_ = gtest_ar_.success_;
                  a.data._1_3_ = gtest_ar_._1_3_;
                  a.size = (size_t)gtest_ar_.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
                  uVar5 = upb_StringView_FromString("nestedkey1");
                  bVar1 = upb_StringView_IsEqual(a,uVar5);
                  iter._0_4_ = CONCAT31(iter._1_3_,bVar1);
                  local_30._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  if (!bVar1) {
                    testing::Message::Message((Message *)&key);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&iter,
                               (AssertionResult *)
                               "upb_StringView_IsEqual(key, upb_StringView_FromString(\"nestedkey1\"))"
                               ,"false","true",(char *)expected_predicate_value);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&value,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                               ,0x119,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&value,(Message *)&key);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
                    std::__cxx11::string::~string((string *)&gtest_ar);
                    if (_key != (AssertHelperData *)0x0) {
                      (**(code **)(*(long *)_key + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&local_30);
                  iter._0_4_ = 0;
                  iter._4_4_ = 0;
                  testing::internal::
                  CmpHelperNE<protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_const*,decltype(nullptr)>
                            ((internal *)&gtest_ar,"value","nullptr",
                             (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage **)
                             &iter_1,(void **)&iter);
                  if (gtest_ar.success_ != false) {
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr(&gtest_ar.message_);
                    iter._0_4_ = protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_a
                                           ((protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage
                                             *)iter_1);
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&gtest_ar,
                               "protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_a(value)"
                               ,"kTestNestedInt32",(int *)&iter,
                               &::(anonymous_namespace)::kTestNestedInt32);
                    if (gtest_ar.success_ == false) {
                      testing::Message::Message((Message *)&iter);
                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl ==
                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )0x0) {
                        pcVar4 = "";
                      }
                      else {
                        pcVar4 = *(char **)gtest_ar.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&key,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                                 ,0x11d,pcVar4);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&key,(Message *)&iter);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key);
                      if ((long *)CONCAT44(iter._4_4_,(int32_t)iter) != (long *)0x0) {
                        (**(code **)(*(long *)CONCAT44(iter._4_4_,(int32_t)iter) + 8))();
                      }
                    }
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr(&gtest_ar.message_);
                    upb_Arena_Free(arena_00);
                    return;
                  }
                  testing::Message::Message((Message *)&iter);
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl ==
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar4 = "";
                  }
                  else {
                    pcVar4 = *(char **)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&key,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                             ,0x11a,pcVar4);
                  testing::internal::AssertHelper::operator=((AssertHelper *)&key,(Message *)&iter);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key);
                  plVar3 = (long *)CONCAT44(iter._4_4_,(int32_t)iter);
                  goto LAB_00156446;
                }
                testing::Message::Message((Message *)&key);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&iter_1,
                           (AssertionResult *)
                           "protobuf_test_messages_proto2_TestAllTypesProto2_map_string_string_next( clone, &key, &value, &iter)"
                           ,"false","true",(char *)expected_predicate_value);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&value,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                           ,0x10a,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&key);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
                std::__cxx11::string::~string((string *)&gtest_ar);
              }
              else {
                testing::Message::Message((Message *)&iter_3);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar_,
                           (AssertionResult *)
                           "protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_next( clone, &key, &value, &iter)"
                           ,"false","true",(char *)expected_predicate_value);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&key,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                           ,0xe7,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                testing::internal::AssertHelper::operator=((AssertHelper *)&key,(Message *)&iter_3);
LAB_001562dc:
                this_00 = &gtest_ar_.message_;
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key);
                std::__cxx11::string::~string((string *)&gtest_ar);
                _key = (AssertHelperData *)iter_3;
              }
            }
            else {
              testing::Message::Message((Message *)&iter_1);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar_,
                         (AssertionResult *)
                         "protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_bool_next( clone, &key, &value, &iter)"
                         ,"false","true",(char *)expected_predicate_value);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&iter_3,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                         ,0xd6,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
              testing::internal::AssertHelper::operator=((AssertHelper *)&iter_3,(Message *)&iter_1)
              ;
LAB_00155f65:
              this_00 = &gtest_ar_.message_;
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iter_3);
              std::__cxx11::string::~string((string *)&gtest_ar);
              _key = (AssertHelperData *)iter_1;
            }
            if (_key != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)_key + 8))();
            }
            goto LAB_00155d7f;
          }
          testing::Message::Message((Message *)&iter);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)
                     "protobuf_test_messages_proto2_TestAllTypesProto2_map_string_nested_message_set( msg, upb_StringView_FromString(\"nestedkey1\"), nested, source_arena)"
                     ,"false","true",(char *)expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&iter_1,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                     ,0xc3,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=((AssertHelper *)&iter_1,(Message *)&iter);
        }
        else {
          testing::Message::Message((Message *)&iter);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)
                     "protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_set( msg, 1, nested2, source_arena)"
                     ,"false","true",(char *)expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&iter_1,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                     ,0xc0,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=((AssertHelper *)&iter_1,(Message *)&iter);
        }
      }
      else {
        testing::Message::Message((Message *)&iter);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "protobuf_test_messages_proto2_TestAllTypesProto2_map_string_string_set( msg, upb_StringView_FromString(\"key1\"), upb_StringView_FromString(\"value1\"), source_arena)"
                   ,"false","true",(char *)expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&iter_1,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                   ,0xb3,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&iter_1,(Message *)&iter);
      }
    }
    else {
      testing::Message::Message((Message *)&iter);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)
                 "protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_set( msg, 12, 1200.5, source_arena)"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&iter_1,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                 ,0xaf,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&iter_1,(Message *)&iter);
    }
  }
  else {
    testing::Message::Message((Message *)&iter);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)
               "protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_bool_set( msg, 0, true, source_arena)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iter_1,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
               ,0xac,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&iter_1,(Message *)&iter);
  }
  this_00 = &gtest_ar_.message_;
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iter_1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if ((long *)CONCAT44(iter._4_4_,(int32_t)iter) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(iter._4_4_,(int32_t)iter) + 8))();
  }
LAB_00155d7f:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  return;
}

Assistant:

TEST(GeneratedCode, DeepCloneMessageMapField) {
  upb_Arena* source_arena = upb_Arena_New();
  protobuf_test_messages_proto2_TestAllTypesProto2* msg =
      protobuf_test_messages_proto2_TestAllTypesProto2_new(source_arena);
  ASSERT_TRUE(
      protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_bool_set(
          msg, 0, true, source_arena));
  ASSERT_TRUE(
      protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_set(
          msg, 12, 1200.5, source_arena));
  ASSERT_TRUE(
      protobuf_test_messages_proto2_TestAllTypesProto2_map_string_string_set(
          msg, upb_StringView_FromString("key1"),
          upb_StringView_FromString("value1"), source_arena));
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* nested =
      protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_new(
          source_arena);
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_set_a(
      nested, kTestNestedInt32);
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* nested2 =
      protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_new(
          source_arena);
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_set_a(
      nested2, kTestNestedInt64);
  ASSERT_TRUE(
      protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_set(
          msg, 1, nested2, source_arena));
  ASSERT_TRUE(
      protobuf_test_messages_proto2_TestAllTypesProto2_map_string_nested_message_set(
          msg, upb_StringView_FromString("nestedkey1"), nested, source_arena));

  upb_Arena* arena = upb_Arena_New();
  protobuf_test_messages_proto2_TestAllTypesProto2* clone =
      (protobuf_test_messages_proto2_TestAllTypesProto2*)upb_Message_DeepClone(
          UPB_UPCAST(msg),
          &protobuf_0test_0messages__proto2__TestAllTypesProto2_msg_init,
          arena);
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_set_a(nested,
                                                                       0);
  upb_Arena_Free(source_arena);
  // Test map<int32, bool>.
  {
    int32_t key;
    bool value;
    size_t iter = kUpb_Map_Begin;

    ASSERT_TRUE(
        protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_bool_next(
            clone, &key, &value, &iter));
    EXPECT_EQ(key, 0);
    EXPECT_EQ(value, true);

    ASSERT_FALSE(
        protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_bool_next(
            clone, &key, &value, &iter));
  }

  // Test map<int32, double>.
  {
    int32_t key;
    double value;
    size_t iter = kUpb_Map_Begin;

    ASSERT_TRUE(
        protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_next(
            clone, &key, &value, &iter));
    EXPECT_EQ(key, 12);
    EXPECT_EQ(value, 1200.5);

    ASSERT_FALSE(
        protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_next(
            clone, &key, &value, &iter));
  }

  // Test map<int32, NestedMessage>.
  {
    int32_t key;
    const protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* value;
    size_t iter = kUpb_Map_Begin;
    ASSERT_TRUE(
        protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_next(
            clone, &key, &value, &iter));
    EXPECT_EQ(key, 1);
    ASSERT_NE(value, nullptr);
    EXPECT_EQ(
        protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_a(value),
        kTestNestedInt64);
    ASSERT_FALSE(
        protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_next(
            clone, &key, &value, &iter));
  }

  // Test map<string, string>.
  {
    upb_StringView key;
    upb_StringView value;
    size_t iter = kUpb_Map_Begin;

    ASSERT_TRUE(
        protobuf_test_messages_proto2_TestAllTypesProto2_map_string_string_next(
            clone, &key, &value, &iter));
    EXPECT_TRUE(upb_StringView_IsEqual(key, upb_StringView_FromString("key1")));
    EXPECT_TRUE(
        upb_StringView_IsEqual(value, upb_StringView_FromString("value1")));
  }

  // Test map<string, NestedMessage>.
  {
    upb_StringView key;
    const protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* value;
    size_t iter = kUpb_Map_Begin;
    ASSERT_TRUE(
        protobuf_test_messages_proto2_TestAllTypesProto2_map_string_nested_message_next(
            clone, &key, &value, &iter));
    EXPECT_TRUE(
        upb_StringView_IsEqual(key, upb_StringView_FromString("nestedkey1")));
    ASSERT_NE(value, nullptr);
    EXPECT_EQ(
        protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_a(value),
        kTestNestedInt32);
  }

  upb_Arena_Free(arena);
}